

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromMemory
          (TinyGLTF *this,Model *model,string *err,string *warn,uchar *bytes,uint size,
          string *base_dir,uint check_sections)

{
  uchar *puVar1;
  ulong uVar2;
  bool ret;
  allocator local_71;
  string local_70 [8];
  string jsonString;
  uint local_48;
  uint model_format;
  uint model_length;
  uint length;
  uint version;
  uint size_local;
  uchar *bytes_local;
  string *warn_local;
  string *err_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  length = size;
  _version = bytes;
  bytes_local = (uchar *)warn;
  warn_local = err;
  err_local = (string *)model;
  model_local = (Model *)this;
  if (size < 0x14) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator=((string *)err,"Too short data size for glTF Binary.");
    }
    this_local._7_1_ = 0;
  }
  else if ((((*bytes == 'g') && (bytes[1] == 'l')) && (bytes[2] == 'T')) && (bytes[3] == 'F')) {
    model_length = *(uint *)(bytes + 4);
    swap4(&model_length);
    model_format = *(uint *)(_version + 8);
    swap4(&model_format);
    local_48 = *(uint *)(_version + 0xc);
    swap4(&local_48);
    jsonString.field_2._12_4_ = *(undefined4 *)(_version + 0x10);
    swap4((uint *)(jsonString.field_2._M_local_buf + 0xc));
    if (((length < local_48 + 0x14) || (local_48 == 0)) ||
       ((length < model_format || (jsonString.field_2._12_4_ != 0x4e4f534a)))) {
      if (warn_local != (string *)0x0) {
        std::__cxx11::string::operator=((string *)warn_local,"Invalid glTF binary.");
      }
      this_local._7_1_ = 0;
    }
    else {
      puVar1 = _version + 0x14;
      uVar2 = (ulong)local_48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,(char *)puVar1,uVar2,&local_71);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      this->is_binary_ = true;
      this->bin_data_ = _version + (ulong)local_48 + 0x1c;
      this->bin_size_ = (ulong)((model_format - local_48) - 0x14);
      this_local._7_1_ =
           LoadFromString(this,(Model *)err_local,warn_local,(string *)bytes_local,
                          (char *)(_version + 0x14),local_48,base_dir,check_sections);
      if ((bool)this_local._7_1_) {
        this_local._7_1_ = true;
      }
      std::__cxx11::string::~string(local_70);
    }
  }
  else {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator=((string *)err,"Invalid magic.");
    }
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TinyGLTF::LoadBinaryFromMemory(Model *model, std::string *err,
                                    std::string *warn,
                                    const unsigned char *bytes,
                                    unsigned int size,
                                    const std::string &base_dir,
                                    unsigned int check_sections) {
  if (size < 20) {
    if (err) {
      (*err) = "Too short data size for glTF Binary.";
    }
    return false;
  }

  if (bytes[0] == 'g' && bytes[1] == 'l' && bytes[2] == 'T' &&
      bytes[3] == 'F') {
    // ok
  } else {
    if (err) {
      (*err) = "Invalid magic.";
    }
    return false;
  }

  unsigned int version;       // 4 bytes
  unsigned int length;        // 4 bytes
  unsigned int model_length;  // 4 bytes
  unsigned int model_format;  // 4 bytes;

  // @todo { Endian swap for big endian machine. }
  memcpy(&version, bytes + 4, 4);
  swap4(&version);
  memcpy(&length, bytes + 8, 4);
  swap4(&length);
  memcpy(&model_length, bytes + 12, 4);
  swap4(&model_length);
  memcpy(&model_format, bytes + 16, 4);
  swap4(&model_format);

  // In case the Bin buffer is not present, the size is exactly 20 + size of
  // JSON contents,
  // so use "greater than" operator.
  if ((20 + model_length > size) || (model_length < 1) || (length > size) ||
      (model_format != 0x4E4F534A)) {  // 0x4E4F534A = JSON format.
    if (err) {
      (*err) = "Invalid glTF binary.";
    }
    return false;
  }

  // Extract JSON string.
  std::string jsonString(reinterpret_cast<const char *>(&bytes[20]),
                         model_length);

  is_binary_ = true;
  bin_data_ = bytes + 20 + model_length +
              8;  // 4 bytes (buffer_length) + 4 bytes(buffer_format)
  bin_size_ =
      length - (20 + model_length);  // extract header + JSON scene data.

  bool ret = LoadFromString(model, err, warn,
                            reinterpret_cast<const char *>(&bytes[20]),
                            model_length, base_dir, check_sections);
  if (!ret) {
    return ret;
  }

  return true;
}